

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

StatsByIP * __thiscall BinHash<StatsByIP>::Retrieve(BinHash<StatsByIP> *this,StatsByIP *key)

{
  StatsByIP *key_00;
  bool bVar1;
  uint32_t uVar2;
  StatsByIP **ppSVar3;
  
  if ((key != (StatsByIP *)0x0) && (this->tableSize != 0)) {
    uVar2 = StatsByIP::Hash(key);
    ppSVar3 = this->hashBin + (ulong)uVar2 % (ulong)this->tableSize;
    while (key_00 = *ppSVar3, key_00 != (StatsByIP *)0x0) {
      bVar1 = StatsByIP::IsSameKey(key,key_00);
      if (bVar1) {
        return key_00;
      }
      ppSVar3 = &key_00->HashNext;
    }
  }
  return (StatsByIP *)0x0;
}

Assistant:

KeyObj * Retrieve(KeyObj * key)
    {
        KeyObj * ret = 0;

        if (key != 0 && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;

            ret = hashBin[hash_index];

            while (ret != NULL && !key->IsSameKey(ret))
            {
                ret = ret->HashNext;
            }
        }

        return ret;
    }